

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# testXMLParser.cxx
# Opt level: O3

int testXMLParser(int param_1,char **param_2)

{
  int iVar1;
  cmXMLParser parser;
  cmXMLParser local_30;
  
  cmXMLParser::cmXMLParser(&local_30);
  iVar1 = cmXMLParser::ParseFile
                    (&local_30,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/ewmailing[P]CMake/Tests/CMakeLib/testXMLParser.xml"
                    );
  if (iVar1 == 0) {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"cmXMLParser failed!",0x13);
    std::ios::widen((char)*(undefined8 *)(std::cerr + -0x18) + -0x28);
    std::ostream::put(-0x28);
    std::ostream::flush();
  }
  cmXMLParser::~cmXMLParser(&local_30);
  return (uint)(iVar1 == 0);
}

Assistant:

int testXMLParser(int, char*[])
{
  // TODO: Derive from parser and check attributes.
  cmXMLParser parser;
  if(!parser.ParseFile(SOURCE_DIR "/testXMLParser.xml"))
    {
    cmsys_ios::cerr << "cmXMLParser failed!" << cmsys_ios::endl;
    return 1;
    }
  return 0;
}